

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O1

void h261_print_gob(h261_gob *gob)

{
  uint uVar1;
  h261_macroblock *phVar2;
  int iVar3;
  int32_t (*paiVar4) [64];
  long lVar5;
  h261_macroblock *phVar6;
  ulong uVar7;
  ulong uVar8;
  
  puts("Group of blocks:");
  printf("\tGN = %d\n",(ulong)gob->gn);
  printf("\tGQUANT = %d\n",(ulong)gob->gquant);
  uVar1 = gob->gn;
  iVar3 = 0xb;
  if ((uVar1 & 1) != 0) {
    iVar3 = 0;
  }
  phVar2 = gob->mbs;
  uVar7 = 0;
  do {
    uVar8 = uVar7 & 0xffffffff;
    printf("\tMacroblock %d (%d, %d):\n",uVar7 & 0xffffffff,
           (ulong)(uint)(((int)uVar7 - ((int)(uVar8 / 0xb) + (int)(uVar8 / 0xb) * 10)) + iVar3),
           (ulong)((int)(uVar8 / 0xb) + (uVar1 - 1 >> 1) * 3));
    printf("\t\tMTYPE =");
    if (gob->mbs[uVar7].mtype == 0) {
      printf(" [SKIPPED]");
    }
    phVar6 = gob->mbs + uVar7;
    if ((phVar6->mtype & 1) != 0) {
      printf(" CODED");
    }
    if ((phVar6->mtype & 2) != 0) {
      printf(" INTRA");
    }
    if ((phVar6->mtype & 4) != 0) {
      printf(" QUANT");
    }
    if ((phVar6->mtype & 8) != 0) {
      printf(" MC");
    }
    if ((phVar6->mtype & 0x10) != 0) {
      printf(" FIL");
    }
    putchar(10);
    if ((phVar6->mtype & 3) != 0) {
      printf("\t\tMQUANT = %d\n",(ulong)phVar6->mquant);
    }
    if ((phVar6->mtype & 8) != 0) {
      printf("\t\tMVD = %d %d\n",(ulong)phVar6->mvd[0],(ulong)phVar6->mvd[1]);
    }
    printf("\t\tCBP = 0x%02x\n",(ulong)phVar6->cbp);
    uVar8 = 0;
    paiVar4 = phVar2->block;
    do {
      if ((phVar6->cbp >> ((uint)uVar8 & 0x1f) & 1) != 0) {
        printf("\t\tBlock %d:",uVar8 & 0xffffffff);
        lVar5 = 0;
        do {
          printf(" %d",(ulong)(uint)(*paiVar4)[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
        putchar(10);
      }
      uVar8 = uVar8 + 1;
      paiVar4 = paiVar4 + 1;
    } while (uVar8 != 6);
    uVar7 = uVar7 + 1;
    phVar2 = (h261_macroblock *)(phVar2->block + 6);
  } while (uVar7 != 0x21);
  return;
}

Assistant:

void h261_print_gob(struct h261_gob *gob) {
	int i;
	printf("Group of blocks:\n");
	printf("\tGN = %d\n", gob->gn);
	printf("\tGQUANT = %d\n", gob->gquant);
	int gx = (gob->gn & 1 ? 0 : H261_GOB_WIDTH);
	int gy = ((gob->gn - 1) >> 1) * H261_GOB_HEIGHT;
	for (i = 0; i < H261_GOB_MBS; i++) {
		int x = gx + i % H261_GOB_WIDTH;
		int y = gy + i / H261_GOB_WIDTH;
		printf("\tMacroblock %d (%d, %d):\n", i, x, y);
		printf("\t\tMTYPE =");
		struct h261_macroblock *mb = &gob->mbs[i];
		if (!mb->mtype) printf(" [SKIPPED]");
		if (mb->mtype & H261_MTYPE_FLAG_CODED) printf(" CODED");
		if (mb->mtype & H261_MTYPE_FLAG_INTRA) printf(" INTRA");
		if (mb->mtype & H261_MTYPE_FLAG_QUANT) printf(" QUANT");
		if (mb->mtype & H261_MTYPE_FLAG_MC) printf(" MC");
		if (mb->mtype & H261_MTYPE_FLAG_FIL) printf(" FIL");
		printf("\n");
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA))
			printf("\t\tMQUANT = %d\n", mb->mquant);
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			printf("\t\tMVD = %d %d\n", mb->mvd[0], mb->mvd[1]);
		}
		printf("\t\tCBP = 0x%02x\n", mb->cbp);
		int j;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				printf("\t\tBlock %d:", j);
				int k;
				for (k = 0; k < 64; k++)
					printf(" %d", mb->block[j][k]);
				printf("\n");
			}
		}
	}
}